

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<FPolySeg,_FPolySeg>::DoCopy
          (TArray<FPolySeg,_FPolySeg> *this,TArray<FPolySeg,_FPolySeg> *other)

{
  uint uVar1;
  FPolySeg *pFVar2;
  FPolySeg *pFVar3;
  long lVar4;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if ((ulong)uVar1 == 0) {
    this->Array = (FPolySeg *)0x0;
  }
  else {
    pFVar3 = (FPolySeg *)
             M_Malloc_Dbg((ulong)uVar1 * 0x28,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                          ,0x199);
    this->Array = pFVar3;
    uVar1 = this->Count;
    if ((ulong)uVar1 != 0) {
      pFVar2 = other->Array;
      lVar4 = 0;
      do {
        *(undefined8 *)((long)&(pFVar3->v1).pos.X + lVar4) =
             *(undefined8 *)((long)&(pFVar2->v1).pos.X + lVar4);
        *(undefined8 *)((long)&(pFVar3->v1).pos.Y + lVar4) =
             *(undefined8 *)((long)&(pFVar2->v1).pos.Y + lVar4);
        *(undefined8 *)((long)&(pFVar3->v2).pos.X + lVar4) =
             *(undefined8 *)((long)&(pFVar2->v2).pos.X + lVar4);
        *(undefined8 *)((long)&(pFVar3->v2).pos.Y + lVar4) =
             *(undefined8 *)((long)&(pFVar2->v2).pos.Y + lVar4);
        *(undefined8 *)((long)&pFVar3->wall + lVar4) = *(undefined8 *)((long)&pFVar2->wall + lVar4);
        lVar4 = lVar4 + 0x28;
      } while ((ulong)uVar1 * 0x28 != lVar4);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}